

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLog.c
# Opt level: O2

int Abc_NtkReadLogFile(char *pFileName,Abc_Cex_t **ppCex,int *pnFrames)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  Vec_Int_t *p;
  int *piVar5;
  Abc_Cex_t *__ptr;
  ulong uVar6;
  int nFrames;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  int local_42c;
  char Buffer [1000];
  
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open log file for reading \"%s\".\n",pFileName);
  }
  else {
    iVar2 = -1;
    fgets(Buffer,1000,__stream);
    iVar1 = bcmp(Buffer,"snl_UNSAT",9);
    if (iVar1 == 0) {
      iVar1 = atoi(Buffer + 9);
      local_42c = -1;
      iVar9 = 1;
    }
    else {
      iVar1 = bcmp(Buffer,"snl_SAT",7);
      if (iVar1 == 0) {
        pcVar8 = strtok(Buffer + 7," \t\n");
        iVar1 = atoi(pcVar8);
        strtok((char *)0x0," \t\n");
        pcVar8 = strtok((char *)0x0," \t\n");
        if (pcVar8 == (char *)0x0) {
          local_42c = -1;
          iVar9 = 0;
        }
        else {
          local_42c = atoi(pcVar8);
          pcVar8 = strtok((char *)0x0," \t\n");
          iVar9 = 0;
          if (pcVar8 != (char *)0x0) {
            iVar2 = atoi(pcVar8);
          }
        }
      }
      else {
        iVar1 = bcmp(Buffer,"snl_UNK",7);
        iVar9 = iVar2;
        local_42c = iVar2;
        if (iVar1 == 0) {
          iVar1 = atoi(Buffer + 7);
        }
        else {
          puts("Unrecognized status.");
          iVar1 = iVar2;
        }
      }
    }
    p = (Vec_Int_t *)malloc(0x10);
    p->nCap = 100;
    p->nSize = 0;
    piVar5 = (int *)malloc(400);
    p->pArray = piVar5;
    while ((uVar3 = fgetc(__stream), uVar3 != 0xffffffff && (uVar3 != 10))) {
      if ((uVar3 & 0xfffffffe) == 0x30) {
        Vec_IntPush(p,uVar3 - 0x30);
      }
    }
    uVar3 = p->nSize;
    while (uVar4 = fgetc(__stream), uVar4 != 0xffffffff) {
      if ((uVar4 & 0xfffffffe) == 0x30) {
        Vec_IntPush(p,uVar4 - 0x30);
      }
    }
    fclose(__stream);
    uVar4 = p->nSize;
    if ((long)(int)uVar4 == 0) {
      Vec_IntFree(p);
LAB_00252ca2:
      if (pnFrames == (int *)0x0) {
        return iVar9;
      }
      *pnFrames = iVar1;
      return iVar9;
    }
    if (iVar2 == -1) {
      iVar2 = iVar1;
    }
    if ((int)uVar3 < 0) {
      pcVar8 = "Cannot read register number.";
    }
    else if (uVar4 == uVar3) {
      pcVar8 = "Cannot read counter example.";
    }
    else {
      nFrames = iVar2 + 1;
      if ((int)(uVar4 - uVar3) % nFrames == 0) {
        __ptr = Abc_CexAlloc(uVar3,(int)(uVar4 - uVar3) / nFrames,nFrames);
        __ptr->iPo = local_42c;
        __ptr->iFrame = iVar2;
        if (uVar4 != __ptr->nBits) {
          __assert_fail("Vec_IntSize(vNums) == pCex->nBits",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcLog.c"
                        ,0xdb,"int Abc_NtkReadLogFile(char *, Abc_Cex_t **, int *)");
        }
        uVar7 = 0;
        uVar6 = 0;
        if (0 < (int)uVar4) {
          uVar6 = (ulong)uVar4;
        }
        for (; (long)uVar7 < (long)(int)uVar4; uVar7 = uVar7 + 1) {
          if (uVar6 == uVar7) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (p->pArray[uVar7] != 0) {
            (&__ptr[1].iPo)[uVar7 >> 5 & 0x7ffffff] =
                 (&__ptr[1].iPo)[uVar7 >> 5 & 0x7ffffff] | 1 << ((byte)uVar7 & 0x1f);
          }
        }
        Vec_IntFree(p);
        if (ppCex == (Abc_Cex_t **)0x0) {
          free(__ptr);
        }
        else {
          *ppCex = __ptr;
        }
        goto LAB_00252ca2;
      }
      pcVar8 = "Incorrect number of bits.";
    }
    puts(pcVar8);
    Vec_IntFree(p);
  }
  return -1;
}

Assistant:

int Abc_NtkReadLogFile( char * pFileName, Abc_Cex_t ** ppCex, int * pnFrames )
{
    FILE * pFile;
    Abc_Cex_t * pCex;
    Vec_Int_t * vNums;
    char Buffer[1000], * pToken, * RetValue;
    int c, nRegs = -1, nFrames = -1, iPo = -1, Status = -1, nFrames2 = -1;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open log file for reading \"%s\".\n" , pFileName );
        return -1;
    }
    RetValue = fgets( Buffer, 1000, pFile );
    if ( !strncmp( Buffer, "snl_UNSAT", strlen("snl_UNSAT") ) )
    {
        Status = 1;
        nFrames = atoi( Buffer + strlen("snl_UNSAT") ); 
    }
    else if ( !strncmp( Buffer, "snl_SAT", strlen("snl_SAT") ) )
    {
        Status = 0;
//        nFrames = atoi( Buffer + strlen("snl_SAT") ); 
        pToken  = strtok( Buffer + strlen("snl_SAT"), " \t\n" );
        nFrames = atoi( pToken ); 
        pToken  = strtok( NULL, " \t\n" );
        pToken  = strtok( NULL, " \t\n" );
        if ( pToken != NULL )
        {
            iPo     = atoi( pToken ); 
            pToken  = strtok( NULL, " \t\n" );
            if ( pToken )
                nFrames2 = atoi( pToken ); 
        }
//        else
//            printf( "Warning! The current status is SAT but the current CEX is not given.\n"  );
    }
    else if ( !strncmp( Buffer, "snl_UNK", strlen("snl_UNK") ) )
    {
        Status = -1;
        nFrames = atoi( Buffer + strlen("snl_UNK") ); 
    }
    else
    {
        printf( "Unrecognized status.\n" );
    }
    // found regs till the new line
    vNums = Vec_IntAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' )
            break;
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    nRegs = Vec_IntSize(vNums);
    // skip till the new line
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    fclose( pFile );
    if ( Vec_IntSize(vNums) )
    {
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        if ( nRegs < 0 )
        {
            printf( "Cannot read register number.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( Vec_IntSize(vNums)-nRegs == 0 )
        {
            printf( "Cannot read counter example.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( (Vec_IntSize(vNums)-nRegs) % (iFrameCex + 1) != 0 )
        {
            printf( "Incorrect number of bits.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        pCex = Abc_CexAlloc( nRegs, (Vec_IntSize(vNums)-nRegs)/(iFrameCex + 1), iFrameCex + 1 );
        pCex->iPo    = iPo;
        pCex->iFrame = iFrameCex;
        assert( Vec_IntSize(vNums) == pCex->nBits );
        for ( c = 0; c < pCex->nBits; c++ )
            if ( Vec_IntEntry(vNums, c) )
                Abc_InfoSetBit( pCex->pData, c );
        Vec_IntFree( vNums );
        if ( ppCex )
            *ppCex = pCex;
        else
            ABC_FREE( pCex );
    }
    else
        Vec_IntFree( vNums );
    if ( pnFrames )
        *pnFrames = nFrames;
    return Status;
}